

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnRetime.c
# Opt level: O0

void Wln_RetMarkChanges_rec(Wln_Ret_t *p,int iObj)

{
  int iVar1;
  int *piVar2;
  bool bVar3;
  int *pDelay;
  int *pLink;
  int local_18;
  int iFanout;
  int k;
  int iObj_local;
  Wln_Ret_t *p_local;
  
  piVar2 = Vec_IntEntryP(&p->vPathDelays,iObj);
  if (-1 < *piVar2) {
    *piVar2 = -1;
    local_18 = 0;
    while( true ) {
      iVar1 = Wln_ObjRefs(p->pNtk,iObj);
      bVar3 = false;
      if (local_18 < iVar1) {
        piVar2 = Wln_RetFanouts(p,iObj);
        pLink._4_4_ = piVar2[local_18 << 1];
        piVar2 = Wln_RetFanouts(p,iObj);
        pDelay = Vec_IntEntryP(&p->vFanins,piVar2[local_18 * 2 + 1]);
        bVar3 = pDelay != (int *)0x0;
      }
      if (!bVar3) break;
      if ((pLink._4_4_ != 0) && (*pDelay == 0)) {
        Wln_RetMarkChanges_rec(p,pLink._4_4_);
      }
      local_18 = local_18 + 1;
    }
  }
  return;
}

Assistant:

void Wln_RetMarkChanges_rec( Wln_Ret_t * p, int iObj )
{
    int k, iFanout, * pLink, * pDelay = Vec_IntEntryP( &p->vPathDelays, iObj );
    if ( *pDelay < 0 )
        return;
    *pDelay = -1;
    Wln_RetForEachFanout( p, iObj, iFanout, pLink, k )
        if ( !pLink[0] )
            Wln_RetMarkChanges_rec( p, iFanout );
}